

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

int slang::ast::BinsSelectExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SymbolIndex SVar1;
  int iVar2;
  ParenthesizedBinsSelectExprSyntax *pPVar3;
  BinsSelectExpressionSyntax *pBVar4;
  BinsSelectConditionExprSyntax *syntax;
  UnaryBinsSelectExprSyntax *syntax_00;
  BinaryBinsSelectExprSyntax *syntax_01;
  SimpleBinsSelectExprSyntax *syntax_02;
  BinSelectWithFilterExprSyntax *syntax_03;
  logic_error *this;
  socklen_t __len_00;
  undefined4 in_register_00000014;
  undefined4 in_register_0000003c;
  string local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  BinsSelectExpr *local_28;
  BinsSelectExpr *result;
  ASTContext *context_local;
  BinsSelectExpressionSyntax *syntax_local;
  
  context_local = (ASTContext *)CONCAT44(in_register_0000003c,__fd);
  SVar1 = context_local->lookupIndex;
  result = (BinsSelectExpr *)__addr;
  if (SVar1 == 0x27) {
    syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::BinSelectWithFilterExprSyntax>
                          ((SyntaxNode *)context_local);
    local_28 = BinSelectWithFilterExpr::fromSyntax(syntax_03,(ASTContext *)result);
  }
  else if (SVar1 == 0x29) {
    syntax_01 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryBinsSelectExprSyntax>
                          ((SyntaxNode *)context_local);
    local_28 = BinaryBinsSelectExpr::fromSyntax(syntax_01,(ASTContext *)result);
  }
  else if (SVar1 == 0x31) {
    syntax = slang::syntax::SyntaxNode::as<slang::syntax::BinsSelectConditionExprSyntax>
                       ((SyntaxNode *)context_local);
    local_28 = ConditionBinsSelectExpr::fromSyntax(syntax,(ASTContext *)result);
  }
  else {
    if (SVar1 == 0x153) {
      pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedBinsSelectExprSyntax>
                         ((SyntaxNode *)context_local);
      pBVar4 = not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*(&pPVar3->expr);
      iVar2 = bind((int)pBVar4,(sockaddr *)result,__len_00);
      return iVar2;
    }
    if (SVar1 == 0x197) {
      syntax_02 = slang::syntax::SyntaxNode::as<slang::syntax::SimpleBinsSelectExprSyntax>
                            ((SyntaxNode *)context_local);
      local_28 = SetExprBinsSelectExpr::fromSyntax(syntax_02,(ASTContext *)result);
    }
    else {
      if (SVar1 != 0x1cf) {
        this = (logic_error *)
               __cxa_allocate_exception(0x10,__addr,CONCAT44(in_register_00000014,__len));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/CoverSymbols.cpp"
                   ,&local_c9);
        std::operator+(&local_a8,&local_c8,":");
        std::__cxx11::to_string(&local_100,0x3ab);
        std::operator+(&local_88,&local_a8,&local_100);
        std::operator+(&local_68,&local_88,": ");
        std::operator+(&local_48,&local_68,"Default case should be unreachable!");
        std::logic_error::logic_error(this,(string *)&local_48);
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      syntax_00 = slang::syntax::SyntaxNode::as<slang::syntax::UnaryBinsSelectExprSyntax>
                            ((SyntaxNode *)context_local);
      local_28 = UnaryBinsSelectExpr::fromSyntax(syntax_00,(ASTContext *)result);
    }
  }
  local_28->syntax = (SyntaxNode *)context_local;
  syntax_local._0_4_ = (int)local_28;
  return (int)syntax_local;
}

Assistant:

const BinsSelectExpr& BinsSelectExpr::bind(const BinsSelectExpressionSyntax& syntax,
                                           const ASTContext& context) {
    BinsSelectExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::ParenthesizedBinsSelectExpr:
            return bind(*syntax.as<ParenthesizedBinsSelectExprSyntax>().expr, context);
        case SyntaxKind::BinsSelectConditionExpr:
            result = &ConditionBinsSelectExpr::fromSyntax(
                syntax.as<BinsSelectConditionExprSyntax>(), context);
            break;
        case SyntaxKind::UnaryBinsSelectExpr:
            result = &UnaryBinsSelectExpr::fromSyntax(syntax.as<UnaryBinsSelectExprSyntax>(),
                                                      context);
            break;
        case SyntaxKind::BinaryBinsSelectExpr:
            result = &BinaryBinsSelectExpr::fromSyntax(syntax.as<BinaryBinsSelectExprSyntax>(),
                                                       context);
            break;
        case SyntaxKind::SimpleBinsSelectExpr:
            result = &SetExprBinsSelectExpr::fromSyntax(syntax.as<SimpleBinsSelectExprSyntax>(),
                                                        context);
            break;
        case SyntaxKind::BinSelectWithFilterExpr:
            result = &BinSelectWithFilterExpr::fromSyntax(
                syntax.as<BinSelectWithFilterExprSyntax>(), context);
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}